

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
* read_neighbors_abi_cxx11_
            (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *__return_storage_ptr__,xml_node<char> *root_node)

{
  xml_node<char> *pxVar1;
  long lVar2;
  uint right_orientation;
  uint left_orientation;
  vector<std::tuple<std::__cxx11::string,unsigned_int,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,unsigned_int,std::__cxx11::string,unsigned_int>>>
  *local_108;
  string right_tile;
  string left_tile;
  string right;
  string left;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_80;
  
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108 = (vector<std::tuple<std::__cxx11::string,unsigned_int,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,unsigned_int,std::__cxx11::string,unsigned_int>>>
               *)__return_storage_ptr__;
  pxVar1 = rapidxml::xml_node<char>::first_node(root_node,"neighbors",(char *)0x0,0,0,true);
  pxVar1 = rapidxml::xml_node<char>::first_node(pxVar1,"neighbor",(char *)0x0,0,0,true);
  for (; pxVar1 != (xml_node<char> *)0x0;
      pxVar1 = rapidxml::xml_node<char>::next_sibling(pxVar1,"neighbor",(char *)0x0,0,0,true)) {
    std::__cxx11::string::string((string *)&local_80,"left",(allocator *)&left_tile);
    rapidxml::get_attribute(&left,pxVar1,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    lVar2 = std::__cxx11::string::find((char *)&left,0x11f458);
    std::__cxx11::string::substr((ulong)&left_tile,(ulong)&left);
    left_orientation = 0;
    if (lVar2 != -1) {
      std::__cxx11::string::substr((ulong)&local_80,(ulong)&left);
      left_orientation = std::__cxx11::stoi((string *)&local_80,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&local_80);
    }
    std::__cxx11::string::string((string *)&local_80,"right",(allocator *)&right_tile);
    rapidxml::get_attribute(&right,pxVar1,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    lVar2 = std::__cxx11::string::find((char *)&right,0x11f458);
    std::__cxx11::string::substr((ulong)&right_tile,(ulong)&right);
    right_orientation = 0;
    if (lVar2 != -1) {
      std::__cxx11::string::substr((ulong)&local_80,(ulong)&right);
      right_orientation = std::__cxx11::stoi((string *)&local_80,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&local_80);
    }
    std::_Tuple_impl<0ul,std::__cxx11::string,unsigned_int,std::__cxx11::string,unsigned_int>::
    _Tuple_impl<std::__cxx11::string&,unsigned_int&,std::__cxx11::string&,unsigned_int&,void>
              ((_Tuple_impl<0ul,std::__cxx11::string,unsigned_int,std::__cxx11::string,unsigned_int>
                *)&local_80,&left_tile,&left_orientation,&right_tile,&right_orientation);
    std::
    vector<std::tuple<std::__cxx11::string,unsigned_int,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,unsigned_int,std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::tuple<std::__cxx11::string,unsigned_int,std::__cxx11::string,unsigned_int>>
              (local_108,
               (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                *)&local_80);
    std::
    _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~_Tuple_impl(&local_80);
    std::__cxx11::string::~string((string *)&right_tile);
    std::__cxx11::string::~string((string *)&right);
    std::__cxx11::string::~string((string *)&left_tile);
    std::__cxx11::string::~string((string *)&left);
  }
  return (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *)local_108;
}

Assistant:

vector<tuple<string, unsigned, string, unsigned>>
read_neighbors(xml_node<> *root_node) {
  vector<tuple<string, unsigned, string, unsigned>> neighbors;
  xml_node<> *neighbor_node = root_node->first_node("neighbors");
  for (xml_node<> *node = neighbor_node->first_node("neighbor"); node;
       node = node->next_sibling("neighbor")) {
    string left = rapidxml::get_attribute(node, "left");
    string::size_type left_delimiter = left.find(" ");
    string left_tile = left.substr(0, left_delimiter);
    unsigned left_orientation = 0;
    if (left_delimiter != string::npos) {
      left_orientation = stoi(left.substr(left_delimiter, string::npos));
    }

    string right = rapidxml::get_attribute(node, "right");
    string::size_type right_delimiter = right.find(" ");
    string right_tile = right.substr(0, right_delimiter);
    unsigned right_orientation = 0;
    if (right_delimiter != string::npos) {
      right_orientation = stoi(right.substr(right_delimiter, string::npos));
    }
    neighbors.push_back(
        {left_tile, left_orientation, right_tile, right_orientation});
  }
  return neighbors;
}